

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

char * print_array(cJSON *item,int depth,int fmt,printbuffer *p)

{
  int iVar1;
  char *__s;
  void *pvVar2;
  int iVar3;
  cJSON *pcVar4;
  char *pcVar5;
  void *__s_00;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  size_t __n;
  ulong uVar9;
  long lVar10;
  cJSON *item_00;
  char *__dest;
  bool bVar11;
  int local_48;
  int local_40;
  
  item_00 = (cJSON *)&item->child;
  __n = 0xfffffffffffffff8;
  uVar7 = 0;
  pcVar4 = item_00;
  do {
    pcVar4 = pcVar4->next;
    uVar7 = uVar7 - 1;
    __n = __n + 8;
  } while (pcVar4 != (cJSON *)0x0);
  if ((int)uVar7 == -1) {
    if (p == (printbuffer *)0x0) {
      pcVar5 = (char *)(*cJSON_malloc)(3);
    }
    else {
      pcVar5 = ensure(p,3);
    }
    if (pcVar5 != (char *)0x0) {
      pcVar5[2] = '\0';
      pcVar5[0] = '[';
      pcVar5[1] = ']';
      return pcVar5;
    }
  }
  else if (p == (printbuffer *)0x0) {
    __s_00 = (*cJSON_malloc)(__n);
    if (__s_00 != (void *)0x0) {
      uVar8 = ~uVar7;
      lVar10 = 0;
      memset(__s_00,0,__n);
      local_40 = 3 - (uint)(fmt == 0);
      local_48 = 5;
      do {
        bVar11 = true;
        do {
          if ((!bVar11) || (item_00 = item_00->next, item_00 == (cJSON *)0x0)) {
            if ((bVar11) &&
               (pcVar5 = (char *)(*cJSON_malloc)((long)local_48),
               (bool)(bVar11 & pcVar5 != (char *)0x0))) {
              pcVar5[0] = '[';
              pcVar5[1] = '\0';
              __dest = pcVar5 + 1;
              uVar9 = 0;
              while (bVar11 = uVar8 != 0, uVar8 = uVar8 - 1, bVar11) {
                __s = *(char **)((long)__s_00 + uVar9 * 8);
                sVar6 = strlen(__s);
                memcpy(__dest,__s,sVar6);
                __dest = __dest + sVar6;
                if ((-uVar7 - 2 & 0xffffffff) != uVar9) {
                  *__dest = ',';
                  if (fmt == 0) {
                    __dest = __dest + 1;
                  }
                  else {
                    __dest[1] = ' ';
                    __dest = __dest + 2;
                  }
                  *__dest = '\0';
                }
                (*cJSON_free)(*(void **)((long)__s_00 + uVar9 * 8));
                uVar9 = uVar9 + 1;
              }
              (*cJSON_free)(__s_00);
              __dest[0] = ']';
              __dest[1] = '\0';
              return pcVar5;
            }
            for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
              pvVar2 = *(void **)((long)__s_00 + uVar7 * 8);
              if (pvVar2 != (void *)0x0) {
                (*cJSON_free)(pvVar2);
              }
            }
            (*cJSON_free)(__s_00);
            return (char *)0x0;
          }
          bVar11 = false;
          pcVar5 = print_value(item_00,depth + 1,fmt,(printbuffer *)0x0);
          *(char **)((long)__s_00 + lVar10 * 8) = pcVar5;
          lVar10 = lVar10 + 1;
        } while (pcVar5 == (char *)0x0);
        sVar6 = strlen(pcVar5);
        local_48 = local_48 + local_40 + (int)sVar6;
      } while( true );
    }
  }
  else {
    iVar1 = p->offset;
    pcVar5 = ensure(p,1);
    if (pcVar5 != (char *)0x0) {
      *pcVar5 = '[';
      p->offset = p->offset + 1;
      while (item_00 = item_00->next, item_00 != (cJSON *)0x0) {
        print_value(item_00,depth + 1,fmt,p);
        iVar3 = update(p);
        p->offset = iVar3;
        if (item_00->next != (cJSON *)0x0) {
          pcVar5 = ensure(p,fmt == 0 ^ 3);
          if (pcVar5 == (char *)0x0) {
            return (char *)0x0;
          }
          *pcVar5 = ',';
          if (fmt == 0) {
            pcVar5 = pcVar5 + 1;
          }
          else {
            pcVar5[1] = ' ';
            pcVar5 = pcVar5 + 2;
          }
          *pcVar5 = '\0';
          p->offset = p->offset + (2 - (uint)(fmt == 0));
        }
      }
      pcVar5 = ensure(p,2);
      if (pcVar5 != (char *)0x0) {
        pcVar5[0] = ']';
        pcVar5[1] = '\0';
        return p->buffer + iVar1;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

static char *print_array(cJSON *item,int depth,int fmt,printbuffer *p)
{
	char **entries;
	char *out=0,*ptr,*ret;int len=5;
	cJSON *child=item->child;
	int numentries=0,i=0,fail=0;
	size_t tmplen=0;
	
	/* How many entries in the array? */
	while (child) numentries++,child=child->next;
	/* Explicitly handle numentries==0 */
	if (!numentries)
	{
		if (p)	out=ensure(p,3);
		else	out=(char*)cJSON_malloc(3);
		if (out) strcpy(out,"[]");
		return out;
	}

	if (p)
	{
		/* Compose the output array. */
		i=p->offset;
		ptr=ensure(p,1);if (!ptr) return 0;	*ptr='[';	p->offset++;
		child=item->child;
		while (child && !fail)
		{
			print_value(child,depth+1,fmt,p);
			p->offset=update(p);
			if (child->next) {len=fmt?2:1;ptr=ensure(p,len+1);if (!ptr) return 0;*ptr++=',';if(fmt)*ptr++=' ';*ptr=0;p->offset+=len;}
			child=child->next;
		}
		ptr=ensure(p,2);if (!ptr) return 0;	*ptr++=']';*ptr=0;
		out=(p->buffer)+i;
	}
	else
	{
		/* Allocate an array to hold the values for each */
		entries=(char**)cJSON_malloc(numentries*sizeof(char*));
		if (!entries) return 0;
		memset(entries,0,numentries*sizeof(char*));
		/* Retrieve all the results: */
		child=item->child;
		while (child && !fail)
		{
			ret=print_value(child,depth+1,fmt,0);
			entries[i++]=ret;
			if (ret) len+=strlen(ret)+2+(fmt?1:0); else fail=1;
			child=child->next;
		}
		
		/* If we didn't fail, try to malloc the output string */
		if (!fail)	out=(char*)cJSON_malloc(len);
		/* If that fails, we fail. */
		if (!out) fail=1;

		/* Handle failure. */
		if (fail)
		{
			for (i=0;i<numentries;i++) if (entries[i]) cJSON_free(entries[i]);
			cJSON_free(entries);
			return 0;
		}
		
		/* Compose the output array. */
		*out='[';
		ptr=out+1;*ptr=0;
		for (i=0;i<numentries;i++)
		{
			tmplen=strlen(entries[i]);memcpy(ptr,entries[i],tmplen);ptr+=tmplen;
			if (i!=numentries-1) {*ptr++=',';if(fmt)*ptr++=' ';*ptr=0;}
			cJSON_free(entries[i]);
		}
		cJSON_free(entries);
		*ptr++=']';*ptr++=0;
	}
	return out;	
}